

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

bool overlapCC(SoftCluster *c1,SoftCluster *c2)

{
  pointer pcVar1;
  double dVar2;
  int iVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  pointer pSVar8;
  pointer pSVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  pointer pSVar13;
  undefined1 auVar14 [16];
  SoftNode sn;
  vector<SoftNode,_std::allocator<SoftNode>_> down;
  vector<SoftNode,_std::allocator<SoftNode>_> up;
  vector<SoftNode,_std::allocator<SoftNode>_> down3;
  vector<SoftNode,_std::allocator<SoftNode>_> up3;
  SoftNode n2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stDown;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stUp;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined2 local_198;
  vector<SoftNode,_std::allocator<SoftNode>_> local_188;
  vector<SoftNode,_std::allocator<SoftNode>_> local_170;
  vector<SoftNode,_std::allocator<SoftNode>_> local_158;
  vector<SoftNode,_std::allocator<SoftNode>_> local_138;
  pointer local_118;
  pointer local_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined2 local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&local_170,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_208);
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&local_188,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_208);
  pSVar9 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar8 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar8->scPos;
      iStack_204 = pSVar8->start;
      iStack_200 = pSVar8->end;
      iStack_1fc = pSVar8->refID;
      pcVar1 = (pSVar8->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar1,pcVar1 + (pSVar8->refName)._M_string_length);
      pcVar1 = (pSVar8->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar1,pcVar1 + (pSVar8->seq)._M_string_length);
      pcVar1 = (pSVar8->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,pcVar1 + (pSVar8->readName)._M_string_length);
      local_198._0_1_ = pSVar8->scAtRight;
      local_198._1_1_ = pSVar8->isSC;
      if (local_198._1_1_ == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar9);
  }
  pSVar9 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar8 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar8->scPos;
      iStack_204 = pSVar8->start;
      iStack_200 = pSVar8->end;
      iStack_1fc = pSVar8->refID;
      pcVar1 = (pSVar8->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar1,pcVar1 + (pSVar8->refName)._M_string_length);
      pcVar1 = (pSVar8->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar1,pcVar1 + (pSVar8->seq)._M_string_length);
      pcVar1 = (pSVar8->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,pcVar1 + (pSVar8->readName)._M_string_length);
      local_198._0_1_ = pSVar8->scAtRight;
      local_198._1_1_ = pSVar8->isSC;
      if (local_198._1_1_ == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_90,&local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar9);
  }
  pSVar9 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    pSVar8 = local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar8->scPos;
      iStack_204 = pSVar8->start;
      iStack_200 = pSVar8->end;
      iStack_1fc = pSVar8->refID;
      pcVar1 = (pSVar8->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar1,pcVar1 + (pSVar8->refName)._M_string_length);
      pcVar1 = (pSVar8->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar1,pcVar1 + (pSVar8->seq)._M_string_length);
      pcVar1 = (pSVar8->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,pcVar1 + (pSVar8->readName)._M_string_length);
      local_198._0_1_ = pSVar8->scAtRight;
      local_198._1_1_ = pSVar8->isSC;
      if (local_198._1_1_ == '\x01') {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_90,&local_1b8);
        iVar11 = iVar11 + (uint)((_Rb_tree_header *)iVar4._M_node !=
                                &local_90._M_impl.super__Rb_tree_header);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar9);
  }
  pSVar9 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar8 = local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_208 = pSVar8->scPos;
      iStack_204 = pSVar8->start;
      iStack_200 = pSVar8->end;
      iStack_1fc = pSVar8->refID;
      pcVar1 = (pSVar8->refName)._M_dataplus._M_p;
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,pcVar1,pcVar1 + (pSVar8->refName)._M_string_length);
      pcVar1 = (pSVar8->seq)._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar1,pcVar1 + (pSVar8->seq)._M_string_length);
      pcVar1 = (pSVar8->readName)._M_dataplus._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,pcVar1 + (pSVar8->readName)._M_string_length);
      local_198._0_1_ = pSVar8->scAtRight;
      local_198._1_1_ = pSVar8->isSC;
      if (local_198._1_1_ == '\x01') {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&local_1b8);
        iVar11 = iVar11 + (uint)((_Rb_tree_header *)iVar4._M_node !=
                                &local_60._M_impl.super__Rb_tree_header);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0]);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar9);
  }
  bVar7 = true;
  if (iVar11 < MIN_SPLIT_SUPPORT) {
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar12 = (int)((ulong)((long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
    do {
      uVar12 = uVar12 - 1;
      if ((int)uVar12 < 0) break;
      uVar10 = (ulong)(uVar12 & 0x7fffffff);
      uVar6 = ((long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].isSC == true) {
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&local_138,
                   local_170.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10);
      }
    } while ((ulong)(((long)local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) <
             3);
    uVar12 = (int)((ulong)((long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
    do {
      uVar12 = uVar12 - 1;
      if ((int)uVar12 < 0) break;
      uVar10 = (ulong)(uVar12 & 0x7fffffff);
      uVar6 = ((long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].isSC == true) {
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&local_158,
                   local_188.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10);
      }
    } while ((ulong)(((long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) <
             3);
    local_118 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar2 = 0.0;
    }
    else {
      iVar11 = 0;
      pSVar9 = local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_1f8[0] = local_1e8;
        local_208 = pSVar9->scPos;
        iStack_204 = pSVar9->start;
        iStack_200 = pSVar9->end;
        iStack_1fc = pSVar9->refID;
        pcVar1 = (pSVar9->refName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar1,pcVar1 + (pSVar9->refName)._M_string_length);
        pcVar1 = (pSVar9->seq)._M_dataplus._M_p;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar1,pcVar1 + (pSVar9->seq)._M_string_length);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        pcVar1 = (pSVar9->readName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar1,pcVar1 + (pSVar9->readName)._M_string_length);
        pSVar8 = local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_198._0_1_ = pSVar9->scAtRight;
        local_198._1_1_ = pSVar9->isSC;
        local_110 = pSVar9;
        for (pSVar13 = local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar13 != pSVar8; pSVar13 = pSVar13 + 1) {
          local_108 = pSVar13->scPos;
          iStack_104 = pSVar13->start;
          iStack_100 = pSVar13->end;
          iStack_fc = pSVar13->refID;
          local_f8[0] = local_e8;
          pcVar1 = (pSVar13->refName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar1,pcVar1 + (pSVar13->refName)._M_string_length);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar1 = (pSVar13->seq)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,pcVar1,pcVar1 + (pSVar13->seq)._M_string_length);
          pcVar1 = (pSVar13->readName)._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,pcVar1,pcVar1 + (pSVar13->readName)._M_string_length);
          local_98._0_1_ = pSVar13->scAtRight;
          local_98._1_1_ = pSVar13->isSC;
          iVar3 = alignSeq(&local_1d8,&local_d8);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          iVar11 = iVar11 + iVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        pSVar9 = local_110;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0]);
        }
        pSVar9 = pSVar9 + 1;
      } while (pSVar9 != local_118);
      dVar2 = (double)iVar11;
    }
    lVar5 = ((long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_158.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x1111111111111111 +
            ((long)local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
    auVar14._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar14._0_8_ = lVar5;
    auVar14._12_4_ = 0x45300000;
    bVar7 = (double)INTRA_ALIGN_SCORE <=
            dVar2 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_158);
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_138);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_188);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_170);
  return bVar7;
}

Assistant:

bool overlapCC(const SoftCluster &c1, const SoftCluster &c2)
{
	int sum = 0;
	std::vector<SoftNode> up(c1.nodes.begin(), c1.nodes.end());
	std::vector<SoftNode> down(c2.nodes.begin(), c2.nodes.end());

	// check if split read already present
	std::set<std::string> stUp, stDown;
	for (SoftNode sn : up)
	{
		if (!sn.isSC)
			stUp.insert(sn.readName);
	}
	for (SoftNode sn : down)
	{
		if (!sn.isSC)
			stDown.insert(sn.readName);
	}
	int srCo = 0;
	for (SoftNode sn : up)
	{
		if (sn.isSC)
		{
			if (stDown.find(sn.readName) != stDown.end())
				srCo += 1;
		}
	}
	for (SoftNode sn : down)
	{
		if (sn.isSC)
		{
			if (stUp.find(sn.readName) != stUp.end())
				srCo += 1;
		}
	}
	if (srCo >= MIN_SPLIT_SUPPORT)
		return true;

	std::vector<SoftNode> up3, down3;
	for (int i = up.size() - 1; i >= 0; i--)
	{
		if (up.at(i).isSC)
			up3.emplace_back(up.at(i));
		if (up3.size() >= 3)
			break;
	}
	for (int i = down.size() - 1; i >= 0; i--)
	{
		if (down.at(i).isSC)
			down3.emplace_back(down.at(i));
		if (down3.size() >= 3)
			break;
	}

	for (SoftNode n1 : up3)
	{
		for (SoftNode n2 : down3)
		{
			int here = alignSeq(n1.seq, n2.seq);
			sum += here;
		}
	}
	double avgScore = 1.0 * sum / (up3.size() + down3.size());
	return avgScore >= INTRA_ALIGN_SCORE;
}